

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ColumnRefExpression *col_ref_p,
          idx_t depth,bool root_expression)

{
  BindingMode BVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  pointer pPVar5;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  string *psVar6;
  DummyBinding *pDVar7;
  pointer pEVar8;
  Binder *pBVar9;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1f0;
  long *local_1e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1e0;
  ColumnRefExpression *local_1d8;
  BoundColumnReferenceInfo ref;
  LogicalType local_148;
  ErrorData error;
  ErrorData local_b0;
  
  BVar1 = Binder::GetBindingMode(this->binder);
  if (BVar1 == EXTRACT_NAMES) {
    LogicalType::LogicalType(&local_148,SQLNULL);
    Value::Value((Value *)&ref,&local_148);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&error,(Value *)&ref);
    local_1e0._M_head_impl = (Expression *)error._0_8_;
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1e0);
    if (local_1e0._M_head_impl != (Expression *)0x0) {
      (*((local_1e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1e0._M_head_impl = (Expression *)0x0;
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    Value::~Value((Value *)&ref);
    LogicalType::~LogicalType(&local_148);
    return __return_storage_ptr__;
  }
  ErrorData::ErrorData(&error);
  (*this->_vptr_ExpressionBinder[2])(&local_1f0,this,col_ref_p,&error);
  if (local_1f0._M_head_impl == (ParsedExpression *)0x0) {
    bVar3 = ColumnRefExpression::IsQualified(col_ref_p);
    if (!bVar3) {
      BindResult::BindResult((BindResult *)&ref);
      iVar4 = (*this->_vptr_ExpressionBinder[3])(this,col_ref_p,root_expression,&ref);
      if ((char)iVar4 != '\0') {
        BindResult::BindResult(__return_storage_ptr__,(BindResult *)&ref);
LAB_015ecaa0:
        BindResult::~BindResult((BindResult *)&ref);
        goto LAB_015ecc51;
      }
      iVar4 = (*this->_vptr_ExpressionBinder[4])(this,col_ref_p);
      if ((char)iVar4 == '\0') {
        psVar6 = ColumnRefExpression::GetColumnName_abi_cxx11_(col_ref_p);
        (*this->_vptr_ExpressionBinder[6])(&local_1e8,this,psVar6);
        if (local_1e8 != (long *)0x0) {
          (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_1e8,depth,0);
          if (local_1e8 != (long *)0x0) {
            (**(code **)(*local_1e8 + 8))();
          }
          goto LAB_015ecaa0;
        }
      }
      BindResult::~BindResult((BindResult *)&ref);
    }
    ErrorData::AddQueryLocation(&error,&col_ref_p->super_ParsedExpression);
    ErrorData::ErrorData(&local_b0,&error);
    BindResult::BindResult(__return_storage_ptr__,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    goto LAB_015ecc51;
  }
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&local_1f0);
  (pPVar5->super_BaseExpression).query_location.index =
       (col_ref_p->super_ParsedExpression).super_BaseExpression.query_location.index;
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&local_1f0);
  if ((pPVar5->super_BaseExpression).type == COLUMN_REF) {
    BindResult::BindResult(__return_storage_ptr__);
    this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_1f0)->super_BaseExpression;
    this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
    psVar6 = ColumnRefExpression::GetTableName_abi_cxx11_(this_01);
    pBVar9 = this->binder;
    if ((pBVar9->macro_binding).ptr == (DummyBinding *)0x0) {
LAB_015ecb0e:
      BindContext::BindColumn((BindResult *)&ref,&pBVar9->bind_context,this_01,depth);
    }
    else {
      local_1d8 = this_01;
      pDVar7 = optional_ptr<duckdb::DummyBinding,_true>::operator->(&pBVar9->macro_binding);
      Binding::GetAlias_abi_cxx11_(&ref.name,&pDVar7->super_Binding);
      _Var2 = ::std::operator==(psVar6,&ref.name);
      ::std::__cxx11::string::~string((string *)&ref);
      pBVar9 = this->binder;
      this_01 = local_1d8;
      if (!_Var2) goto LAB_015ecb0e;
      pDVar7 = optional_ptr<duckdb::DummyBinding,_true>::operator->(&pBVar9->macro_binding);
      this_01 = local_1d8;
      (*(pDVar7->super_Binding)._vptr_Binding[3])(&ref,pDVar7,local_1d8,depth);
    }
    BindResult::operator=(__return_storage_ptr__,(BindResult *)&ref);
    BindResult::~BindResult((BindResult *)&ref);
    if ((__return_storage_ptr__->error).initialized == true) {
      ErrorData::AddQueryLocation(&__return_storage_ptr__->error,&col_ref_p->super_ParsedExpression)
      ;
      goto LAB_015ecc51;
    }
    ref.name._M_dataplus._M_p = (pointer)&ref.name.field_2;
    ref.name._M_string_length = 0;
    ref.name.field_2._M_local_buf[0] = '\0';
    ref.query_location.index = 0xffffffffffffffff;
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    back(&this_01->column_names);
    ::std::__cxx11::string::_M_assign((string *)&ref);
    ref.query_location.index =
         (this_01->super_ParsedExpression).super_BaseExpression.query_location.index;
    ::std::
    vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
    emplace_back<duckdb::BoundColumnReferenceInfo>
              (&(this->bound_columns).
                super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
               ,&ref);
  }
  else {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&local_1f0);
    ::std::__cxx11::string::string((string *)&ref,(string *)&(pPVar5->super_BaseExpression).alias);
    (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,&local_1f0,depth,0);
    if ((Expression *)
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&__return_storage_ptr__->expression);
      ::std::__cxx11::string::operator=
                ((string *)&(pEVar8->super_BaseExpression).alias,(string *)&ref);
    }
  }
  ::std::__cxx11::string::~string((string *)&ref);
LAB_015ecc51:
  if (local_1f0._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_1f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ErrorData::~ErrorData(&error);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ColumnRefExpression &col_ref_p, idx_t depth, bool root_expression) {
	if (binder.GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		return BindResult(make_uniq<BoundConstantExpression>(Value(LogicalType::SQLNULL)));
	}

	ErrorData error;
	auto expr = QualifyColumnName(col_ref_p, error);
	if (!expr) {
		if (!col_ref_p.IsQualified()) {
			// column was not found
			// first try to bind it as an alias
			BindResult alias_result;
			auto found_alias = TryBindAlias(col_ref_p, root_expression, alias_result);
			if (found_alias) {
				return alias_result;
			}
			found_alias = QualifyColumnAlias(col_ref_p);
			if (!found_alias) {
				// column was not found - check if it is a SQL value function
				auto value_function = GetSQLValueFunction(col_ref_p.GetColumnName());
				if (value_function) {
					return BindExpression(value_function, depth);
				}
			}
		}
		error.AddQueryLocation(col_ref_p);
		return BindResult(std::move(error));
	}

	expr->SetQueryLocation(col_ref_p.GetQueryLocation());

	// the above QualifyColumName returns a generated expression for a generated
	// column, and struct_extract for a struct, or a lambda reference expression,
	// all of them are not column reference expressions, so we return here
	if (expr->GetExpressionType() != ExpressionType::COLUMN_REF) {
		auto alias = expr->GetAlias();
		auto result = BindExpression(expr, depth);
		if (result.expression) {
			result.expression->SetAlias(std::move(alias));
		}
		return result;
	}

	// the above QualifyColumnName returned an individual column reference
	// expression, which we resolve to either a base table or a subquery expression,
	// and if it was a macro parameter, then we let macro_binding bind it to the argument
	BindResult result;
	auto &col_ref = expr->Cast<ColumnRefExpression>();
	D_ASSERT(col_ref.IsQualified());
	auto &table_name = col_ref.GetTableName();

	if (binder.macro_binding && table_name == binder.macro_binding->GetAlias()) {
		result = binder.macro_binding->Bind(col_ref, depth);
	} else {
		result = binder.bind_context.BindColumn(col_ref, depth);
	}

	if (result.HasError()) {
		result.error.AddQueryLocation(col_ref_p);
		return result;
	}

	// we bound the column reference
	BoundColumnReferenceInfo ref;
	ref.name = col_ref.column_names.back();
	ref.query_location = col_ref.GetQueryLocation();
	bound_columns.push_back(std::move(ref));
	return result;
}